

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorwiseOp.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator+=
          (VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other)

{
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other_00;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  Type local_30;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *local_18;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other_local;
  VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_local;
  
  local_18 = other;
  other_local = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)this;
  other_00 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             EigenBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::derived
                       ((EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                        other);
  extendedTo<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>(&local_30,this,other_00);
  pMVar1 = MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                     (*(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> **)this,
                      (MatrixBase<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,_1>_>
                       *)&local_30);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    ExpressionType& operator+=(const DenseBase<OtherDerived>& other)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(OtherDerived)
      EIGEN_STATIC_ASSERT_SAME_XPR_KIND(ExpressionType, OtherDerived)
      return const_cast<ExpressionType&>(m_matrix += extendedTo(other.derived()));
    }